

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O2

void __thiscall AllFloatsRoundtripTest::AllFloatsRoundtripTest(AllFloatsRoundtripTest *this)

{
  ThreadedTest::ThreadedTest(&this->super_ThreadedTest);
  (this->super_ThreadedTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_00136f10;
  return;
}

Assistant:

static LiteralType ClassifyFloat(uint32_t float_bits) {
    if (is_infinity_or_nan(float_bits)) {
      if (float_bits & 0x7fffff) {
        return LiteralType::Nan;
      } else {
        return LiteralType::Infinity;
      }
    } else {
      return LiteralType::Hexfloat;
    }
  }